

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  long lVar1;
  int iVar2;
  Expr *pExpr;
  int in_ECX;
  int *in_RDX;
  ExprList *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Expr *pSub;
  Expr *pDup;
  sqlite3 *db;
  int nInit;
  int i;
  int iDummy;
  Expr *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  int iVar4;
  sqlite3 *in_stack_ffffffffffffffb0;
  Expr *p;
  int local_30;
  ExprList *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RSI;
  if (in_RDX != (int *)0x0) {
    if (in_RSI == (ExprList *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = in_RSI->nExpr;
    }
    iVar4 = iVar3;
    for (local_30 = 0; local_30 < *in_RDX; local_30 = local_30 + 1) {
      p = (Expr *)*in_RDI;
      pExpr = sqlite3ExprDup(in_stack_ffffffffffffffb0,
                             (Expr *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
                             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      if (*(char *)((long)&p[1].pRight + 7) != '\0') {
        sqlite3ExprDelete(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        break;
      }
      if (in_ECX != 0) {
        in_stack_ffffffffffffffb0 = (sqlite3 *)sqlite3ExprSkipCollateAndLikely(pExpr);
        iVar2 = sqlite3ExprIsInteger(p,(int *)pExpr,(Parse *)in_stack_ffffffffffffffb0);
        if (iVar2 != 0) {
          *(undefined1 *)&in_stack_ffffffffffffffb0->pVfs = 0x7a;
          *(uint *)((long)&in_stack_ffffffffffffffb0->pVfs + 4) =
               *(uint *)((long)&in_stack_ffffffffffffffb0->pVfs + 4) & 0xcffff7ff;
          in_stack_ffffffffffffffb0->pVdbe = (Vdbe *)0x0;
        }
      }
      local_20 = sqlite3ExprListAppend
                           ((Parse *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
                            (ExprList *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (local_20 != (ExprList *)0x0) {
        local_20->a[iVar3 + local_30].fg.sortFlags = (u8)in_RDX[(long)local_30 * 6 + 6];
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      sqlite3 *db = pParse->db;
      Expr *pDup = sqlite3ExprDup(db, pAppend->a[i].pExpr, 0);
      if( db->mallocFailed ){
        sqlite3ExprDelete(db, pDup);
        break;
      }
      if( bIntToNull ){
        int iDummy;
        Expr *pSub;
        pSub = sqlite3ExprSkipCollateAndLikely(pDup);
        if( sqlite3ExprIsInteger(pSub, &iDummy, 0) ){
          pSub->op = TK_NULL;
          pSub->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
          pSub->u.zToken = 0;
        }
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].fg.sortFlags = pAppend->a[i].fg.sortFlags;
    }
  }
  return pList;
}